

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexTriangleFilter::applyIter
          (PtexTriangleFilter *this,PtexTriangleKernelIter *k,PtexFaceData *dh)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined3 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  byte bVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  PtexPtr<Ptex::v2_2::PtexFaceData> th;
  PtexTriangleKernelIter kt;
  undefined4 uVar7;
  
  iVar9 = (*dh->_vptr_PtexFaceData[3])(dh);
  if ((char)iVar9 == '\0') {
    iVar9 = (*dh->_vptr_PtexFaceData[7])(dh);
    if ((char)iVar9 != '\0') {
      uVar10 = (*dh->_vptr_PtexFaceData[8])(dh);
      kt.w2 = k->w2;
      kt.A = k->A;
      uVar4 = k->B;
      uVar5 = k->C;
      uVar6 = k->valid;
      uVar8 = *(undefined3 *)&k->field_0x31;
      uVar7 = CONCAT31(uVar8,uVar6);
      kt.wscale = k->wscale;
      kt.weight = k->weight;
      uVar19 = 1 << ((byte)(uVar10 & 0xffff) & 0x1f);
      bVar14 = (byte)((uVar10 & 0xffff) >> 8);
      uVar20 = 1 << (bVar14 & 0x1f);
      kt.u = 0.0;
      kt.rowlen = uVar19;
      iVar9 = k->rowlen;
      iVar22 = iVar9 / (int)uVar19;
      uVar17 = (long)k->v1 / (long)(int)uVar20;
      iVar1 = k->v2;
      iVar11 = (int)uVar17 * iVar22;
      uVar17 = uVar17 & 0xffffffff;
      kt.B = (float)uVar4;
      kt.C = (float)uVar5;
      kt._48_4_ = uVar7;
      while (iVar15 = (int)uVar17, iVar15 <= (iVar1 + -1) / (int)uVar20) {
        iVar21 = iVar15 << (bVar14 & 0x1f);
        kt.u1 = 0;
        kt.v = k->v - (float)iVar21;
        kt.v1 = k->v1 - iVar21;
        if (kt.v1 < 1) {
          kt.v1 = 0;
        }
        kt.w1 = 0;
        uVar12 = k->v2 - iVar21;
        if ((int)uVar20 <= (int)uVar12) {
          uVar12 = uVar20;
        }
        kt._24_8_ = (ulong)uVar12 << 0x20;
        iVar2 = k->u2;
        uVar17 = (long)k->u1 / (long)(int)uVar19 & 0xffffffff;
        while (iVar23 = (int)uVar17, iVar23 <= (iVar2 + -1) / (int)uVar19) {
          iVar13 = iVar23 << ((byte)uVar10 & 0x1f);
          iVar18 = iVar9 - (iVar21 + uVar19 + iVar13);
          kt.u = k->u - (float)iVar13;
          iVar16 = k->u1 - iVar13;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          kt.u1 = iVar16;
          uVar12 = k->u2 - iVar13;
          if ((int)uVar19 <= (int)uVar12) {
            uVar12 = uVar19;
          }
          kt.u2 = uVar12;
          kt.w1 = k->w1 - iVar18;
          kt.w2 = k->w2 - iVar18;
          iVar13 = (*dh->_vptr_PtexFaceData[9])(dh,(ulong)(uint)(iVar11 + iVar23));
          th._ptr = (PtexFaceData *)CONCAT44(extraout_var_00,iVar13);
          if (th._ptr != (PtexFaceData *)0x0) {
            kt._52_8_ = kt._52_8_ & 0xffffffff;
            iVar13 = (*(th._ptr)->_vptr_PtexFaceData[3])(th._ptr);
            pfVar3 = this->_result;
            if ((char)iVar13 == '\0') {
              iVar13 = (*(th._ptr)->_vptr_PtexFaceData[6])();
              PtexTriangleKernelIter::apply
                        (&kt,pfVar3,
                         (void *)(CONCAT44(extraout_var_02,iVar13) + (long)this->_firstChanOffset),
                         this->_dt,this->_nchan,this->_ntxchan);
            }
            else {
              iVar13 = (*(th._ptr)->_vptr_PtexFaceData[6])();
              PtexTriangleKernelIter::applyConst
                        (&kt,pfVar3,
                         (void *)(CONCAT44(extraout_var_01,iVar13) + (long)this->_firstChanOffset),
                         this->_dt,this->_nchan);
            }
            this->_weight = kt.weight + this->_weight;
          }
          PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr(&th);
          uVar17 = (ulong)(iVar23 + 1);
        }
        iVar11 = iVar11 + iVar22;
        uVar17 = (ulong)(iVar15 + 1);
      }
      return;
    }
    pfVar3 = this->_result;
    iVar9 = (*dh->_vptr_PtexFaceData[6])(dh);
    PtexTriangleKernelIter::apply
              (k,pfVar3,(void *)((long)this->_firstChanOffset + CONCAT44(extraout_var_03,iVar9)),
               this->_dt,this->_nchan,this->_ntxchan);
  }
  else {
    pfVar3 = this->_result;
    iVar9 = (*dh->_vptr_PtexFaceData[6])(dh);
    PtexTriangleKernelIter::applyConst
              (k,pfVar3,(void *)((long)this->_firstChanOffset + CONCAT44(extraout_var,iVar9)),
               this->_dt,this->_nchan);
  }
  this->_weight = k->weight + this->_weight;
  return;
}

Assistant:

void PtexTriangleFilter::applyIter(PtexTriangleKernelIter& k, PtexFaceData* dh)
{
    if (dh->isConstant()) {
        k.applyConst(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan);
        _weight += k.weight;
    }
    else if (dh->isTiled()) {
        Ptex::Res tileres = dh->tileRes();
        PtexTriangleKernelIter kt = k;
        int tileresu = tileres.u();
        int tileresv = tileres.v();
        kt.rowlen = tileresu;
        int ntilesu = k.rowlen / kt.rowlen;
        int wOffsetBase = k.rowlen - tileresu;
        for (int tilev = k.v1 / tileresv, tilevEnd = (k.v2-1) / tileresv; tilev <= tilevEnd; tilev++) {
            int vOffset = tilev * tileresv;
            kt.v = k.v - (float)vOffset;
            kt.v1 = PtexUtils::max(0, k.v1 - vOffset);
            kt.v2 = PtexUtils::min(k.v2 - vOffset, tileresv);
            for (int tileu = k.u1 / tileresu, tileuEnd = (k.u2-1) / tileresu; tileu <= tileuEnd; tileu++) {
                int uOffset = tileu * tileresu;
                int wOffset = wOffsetBase - uOffset - vOffset;
                kt.u = k.u - (float)uOffset;
                kt.u1 = PtexUtils::max(0, k.u1 - uOffset);
                kt.u2 = PtexUtils::min(k.u2 - uOffset, tileresu);
                kt.w1 = k.w1 - wOffset;
                kt.w2 = k.w2 - wOffset;
                PtexPtr<PtexFaceData> th ( dh->getTile(tilev * ntilesu + tileu) );
                if (th) {
                    kt.weight = 0;
                    if (th->isConstant())
                        kt.applyConst(_result, (char*)th->getData()+_firstChanOffset, _dt, _nchan);
                    else
                        kt.apply(_result, (char*)th->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
                    _weight += kt.weight;
                }
            }
        }
    }
    else {
        k.apply(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
        _weight += k.weight;
    }
}